

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O1

glyph_metrics_t * __thiscall
QFontEngineFT::scaledBitmapMetrics
          (glyph_metrics_t *__return_storage_ptr__,QFontEngineFT *this,glyph_metrics_t *m,
          QTransform *t)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double sx;
  long lVar7;
  qreal *pqVar8;
  qreal *pqVar9;
  long in_FS_OFFSET;
  QTransform trans;
  QRectF local_d8;
  QPointF local_b8;
  QRectF local_a8;
  qreal local_80 [9];
  ushort local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar8 = (qreal *)&DAT_006d4ae8;
  pqVar9 = local_80;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pqVar9 = *pqVar8;
    pqVar8 = pqVar8 + 1;
    pqVar9 = pqVar9 + 1;
  }
  pqVar8 = (qreal *)&DAT_006d4bd8;
  pqVar9 = local_80;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pqVar9 = *pqVar8;
    pqVar8 = pqVar8 + 1;
    pqVar9 = pqVar9 + 1;
  }
  local_38 = local_38 & 0xfc00;
  QTransform::setMatrix
            ((QTransform *)local_80,t->m_matrix[0][0],t->m_matrix[0][1],t->m_matrix[0][2],
             t->m_matrix[1][0],t->m_matrix[1][1],t->m_matrix[1][2],0.0,0.0,t->m_matrix[2][2]);
  sx = (double)(this->scalableBitmapScaleFactor).val * 0.015625;
  QTransform::scale((QTransform *)local_80,sx,sx);
  uVar1 = m->x;
  uVar4 = m->y;
  local_a8.xp = (double)(int)uVar1 * 0.015625;
  local_a8.yp = (double)(int)uVar4 * 0.015625;
  uVar2 = m->width;
  uVar5 = m->height;
  local_a8.w = (double)(int)uVar2 * 0.015625;
  local_a8.h = (double)(int)uVar5 * 0.015625;
  uVar3 = m->xoff;
  uVar6 = m->yoff;
  local_b8.yp._0_4_ = SUB84((double)(int)uVar6 * 0.015625,0);
  local_b8.xp = (double)(int)uVar3 * 0.015625;
  local_b8.yp._4_4_ = (int)((ulong)((double)(int)uVar6 * 0.015625) >> 0x20);
  QTransform::mapRect(&local_d8,(QTransform *)local_80,&local_a8);
  local_a8.w = local_d8.w;
  local_a8.h = local_d8.h;
  local_a8.xp = local_d8.xp;
  local_a8.yp = local_d8.yp;
  local_b8 = QTransform::map((QTransform *)local_80,&local_b8);
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->width = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->xoff = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->x = 6400000;
  __return_storage_ptr__->y = 6400000;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->xoff = 0;
  __return_storage_ptr__->yoff = 0;
  (__return_storage_ptr__->x).val = (int)(local_a8.xp * 64.0);
  (__return_storage_ptr__->y).val = (int)(local_a8.yp * 64.0);
  (__return_storage_ptr__->width).val = (int)(local_a8.w * 64.0);
  (__return_storage_ptr__->height).val = (int)(local_a8.h * 64.0);
  __return_storage_ptr__->xoff = (QFixed)(int)(local_b8.xp * 64.0);
  __return_storage_ptr__->yoff = (QFixed)(int)(local_b8.yp * 64.0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

glyph_metrics_t QFontEngineFT::scaledBitmapMetrics(const glyph_metrics_t &m, const QTransform &t) const
{
    QTransform trans;
    trans.setMatrix(t.m11(), t.m12(), t.m13(),
                    t.m21(), t.m22(), t.m23(),
                    0, 0, t.m33());
    const qreal scaleFactor = scalableBitmapScaleFactor.toReal();
    trans.scale(scaleFactor, scaleFactor);

    QRectF rect(m.x.toReal(), m.y.toReal(), m.width.toReal(), m.height.toReal());
    QPointF offset(m.xoff.toReal(), m.yoff.toReal());

    rect = trans.mapRect(rect);
    offset = trans.map(offset);

    glyph_metrics_t metrics;
    metrics.x = QFixed::fromReal(rect.x());
    metrics.y = QFixed::fromReal(rect.y());
    metrics.width = QFixed::fromReal(rect.width());
    metrics.height = QFixed::fromReal(rect.height());
    metrics.xoff = QFixed::fromReal(offset.x());
    metrics.yoff = QFixed::fromReal(offset.y());
    return metrics;
}